

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceGroups.cxx
# Opt level: O0

int testCTestResourceGroups(int param_1,char **param_2)

{
  bool bVar1;
  reference expected_00;
  ExpectedParseResult *expected;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_> *__range1;
  int retval;
  char **param_1_local;
  int param_0_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_>::begin
                     (&expectedResults);
  expected = (ExpectedParseResult *)
             std::vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_>::end
                       (&expectedResults);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ExpectedParseResult_*,_std::vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_>_>
                                *)&expected);
    if (!bVar1) break;
    expected_00 = __gnu_cxx::
                  __normal_iterator<const_ExpectedParseResult_*,_std::vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_>_>
                  ::operator*(&__end1);
    bVar1 = TestExpectedParseResult(expected_00);
    if (!bVar1) {
      __range1._4_4_ = 1;
    }
    __gnu_cxx::
    __normal_iterator<const_ExpectedParseResult_*,_std::vector<ExpectedParseResult,_std::allocator<ExpectedParseResult>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int testCTestResourceGroups(int /*unused*/, char* /*unused*/[])
{
  int retval = 0;

  for (auto const& expected : expectedResults) {
    if (!TestExpectedParseResult(expected)) {
      retval = 1;
    }
  }

  return retval;
}